

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O0

void __thiscall
ArchiveSpan_ReadSingleElementSpan_Test::TestBody(ArchiveSpan_ReadSingleElementSpan_Test *this)

{
  bool bVar1;
  MockSpec<void_(int_&)> *this_00;
  TypedExpectation<void_(int_&)> *this_01;
  MockSpec<void_(pstore::gsl::span<int,__1L>)> *this_02;
  TypedExpectation<void_(pstore::gsl::span<int,__1L>)> *this_03;
  reference lhs;
  char *message;
  AssertHelper local_210;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar;
  array<int,_1UL> local_1e0;
  WithoutMatchers local_1d9;
  array<int,_1UL> a;
  MockSpec<void_(pstore::gsl::span<int,__1L>)> local_1c0;
  int local_1a0;
  SetArgRefereeAction<0UL,_int> local_19c;
  Action<void_(int_&)> local_198;
  WithoutMatchers local_175 [13];
  Matcher<int_&> local_168;
  MockSpec<void_(int_&)> local_150;
  undefined1 local_130 [8];
  mock_span_archive archive;
  ArchiveSpan_ReadSingleElementSpan_Test *this_local;
  
  archive.gmock01_getn_mock_286.super_UntypedFunctionMockerBase.untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::mock_span_archive
            ((mock_span_archive *)local_130);
  testing::Matcher<int&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<int&> *)&local_168,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::gmock_get
            (&local_150,(mock_span_archive *)local_130,&local_168);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(int_&)>::operator()(&local_150,local_175,(void *)0x0);
  this_01 = testing::internal::MockSpec<void_(int_&)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x164,"archive","get (_)");
  local_1a0 = 0x17;
  local_19c = testing::SetArgReferee<0ul,int>(&local_1a0);
  testing::Action<void(int&)>::Action<testing::internal::SetArgRefereeAction<0ul,int>,void>
            ((Action<void(int&)> *)&local_198,&local_19c);
  testing::internal::TypedExpectation<void_(int_&)>::WillOnce(this_01,&local_198);
  testing::Action<void_(int_&)>::~Action(&local_198);
  testing::internal::MockSpec<void_(int_&)>::~MockSpec(&local_150);
  testing::Matcher<int_&>::~Matcher(&local_168);
  testing::Matcher<pstore::gsl::span<int,-1l>>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<int,_1l>> *)&a,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::gmock_getn_mock
            (&local_1c0,(mock_span_archive *)local_130,(Matcher<pstore::gsl::span<int,__1L>_> *)&a);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::operator()
                      (&local_1c0,&local_1d9,(void *)0x0);
  this_03 = testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x165,"archive","getn_mock (_)");
  testing::internal::TypedExpectation<void_(pstore::gsl::span<int,_-1L>)>::Times(this_03,0);
  testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::~MockSpec(&local_1c0);
  testing::Matcher<pstore::gsl::span<int,_-1L>_>::~Matcher
            ((Matcher<pstore::gsl::span<int,__1L>_> *)&a);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,1ul>(&local_1e0);
  pstore::serialize::read<(anonymous_namespace)::ArchiveSpan::mock_span_archive&,int>
            ((mock_span_archive *)local_130,
             (span<int,_1L>)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  lhs = std::array<int,_1UL>::operator[](&local_1e0,0);
  local_1fc = 0x17;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1f8,"a[0]","23",lhs,&local_1fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
               ,0x169,message);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::~mock_span_archive
            ((mock_span_archive *)local_130);
  return;
}

Assistant:

TEST_F (ArchiveSpan, ReadSingleElementSpan) {
    using ::testing::_;
    using ::testing::SetArgReferee;

    mock_span_archive archive;
    EXPECT_CALL (archive, get (_)).WillOnce (SetArgReferee<0> (23));
    EXPECT_CALL (archive, getn_mock (_)).Times (0);

    std::array<int, 1> a;
    pstore::serialize::read (archive, ::pstore::gsl::make_span (a));
    EXPECT_EQ (a[0], 23);
}